

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwGetWindowPos(GLFWwindow *handle,int *xpos,int *ypos)

{
  _GLFWwindow *window;
  int iStack_20;
  int iStack_1c;
  undefined1 auStack_18 [8];
  
  if (xpos != (int *)0x0) {
    *xpos = 0;
  }
  if (ypos != (int *)0x0) {
    *ypos = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  XTranslateCoordinates
            (_glfw.x11.display,*(undefined8 *)(handle + 0x348),_glfw.x11.root,0,0,&iStack_1c,
             &iStack_20,auStack_18);
  if (xpos != (int *)0x0) {
    *xpos = iStack_1c;
  }
  if (ypos != (int *)0x0) {
    *ypos = iStack_20;
  }
  return;
}

Assistant:

GLFWAPI void glfwGetWindowPos(GLFWwindow* handle, int* xpos, int* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();
    _glfwPlatformGetWindowPos(window, xpos, ypos);
}